

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
Player::action(vector<int,_std::allocator<int>_> *__return_storage_ptr__,Player *this,int choice)

{
  int b;
  int a;
  vector<int,_std::allocator<int>_> local_28;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  switch(choice) {
  case 0:
    a = 1;
    break;
  case 1:
    a = -1;
    break;
  case 2:
    a = 0;
    b = 1;
    goto LAB_001049ff;
  case 3:
    a = 0;
    b = -1;
    goto LAB_001049ff;
  default:
    a = 0;
  }
  b = 0;
LAB_001049ff:
  move(&local_28,this,a,b);
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start =
       local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish =
       local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> Player::action(int choice)
{
    std::vector<int> vec1;
    if (choice == 0)
    {
        vec1 = this->move(1, 0);
    }
    else if (choice == 1)
    {
        vec1 = this->move(-1, 0);
    }
    else if (choice == 2)
    {
        vec1 = this->move(0, 1);
    }
    else if (choice == 3)
    {
        vec1 = this->move(0, -1);
    }
    else
    {
        vec1 = this->move(0, 0);
    }
    /**
    else if (choice == 4)
    {
        vec1 = this->move(0, 0, 1);
    }
    else if (choice == 5)
    {
        vec1 = this->move(0, 0, -1); //Looks good
     }
     **/
    return vec1;
}